

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_ai.cpp
# Opt level: O0

string * __thiscall cpp_client::Base_ai::get_setting_abi_cxx11_(Base_ai *this,char *key)

{
  char *pcVar1;
  int iVar2;
  size_type sVar3;
  allocator local_71;
  string local_70 [39];
  allocator local_49;
  string local_48 [39];
  allocator local_21;
  char *local_20;
  char *key_local;
  Base_ai *this_local;
  
  local_20 = key;
  key_local = (char *)this;
  if (get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_,"",&local_21);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
      __cxa_atexit(std::__cxx11::string::~string,
                   get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_);
    }
  }
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar1,&local_49);
  sVar3 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->passed_params_,(key_type *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar1 = local_20;
  if (sVar3 == 0) {
    this_local = (Base_ai *)get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar1,&local_71);
    this_local = (Base_ai *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(&this->passed_params_,(key_type *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return (string *)this_local;
}

Assistant:

const std::string& Base_ai::get_setting(const char* key) const noexcept
{
   // Have a dummy string for return null if needed
   static const std::string dummy{""};
   if(passed_params_.count(key))
   {
      return passed_params_.at(key);
   }
   else
   {
      return dummy;
   }
}